

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_ncell(REF_GRID ref_grid,REF_INT *ncell)

{
  REF_CELL local_28;
  REF_CELL ref_cell;
  REF_INT group;
  REF_INT *ncell_local;
  REF_GRID ref_grid_local;
  
  *ncell = 0;
  ref_cell._4_4_ = 0;
  local_28 = ref_grid->cell[0];
  while (ref_cell._4_4_ < 0x10) {
    *ncell = local_28->n + *ncell;
    ref_cell._4_4_ = ref_cell._4_4_ + 1;
    local_28 = ref_grid->cell[ref_cell._4_4_];
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_grid_ncell(REF_GRID ref_grid, REF_INT *ncell) {
  REF_INT group;
  REF_CELL ref_cell;
  *ncell = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    (*ncell) += ref_cell_n(ref_cell);
  }
  return REF_SUCCESS;
}